

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int nng_url_sprintf(char *str,size_t size,nng_url *url)

{
  uint uVar1;
  char *__s1;
  char *__s;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *local_e0;
  char *local_c8;
  char local_71 [8];
  char portstr [8];
  _Bool do_port;
  char *hostcb;
  char *hostob;
  char *host;
  char *scheme;
  nng_url *url_local;
  size_t size_local;
  char *str_local;
  
  __s1 = url->u_scheme;
  __s = url->u_hostname;
  hostcb = "";
  stack0xffffffffffffff98 = "";
  portstr[0] = '\x01';
  iVar3 = strcmp(__s1,"ipc");
  if ((((iVar3 != 0) && (iVar3 = strcmp(__s1,"inproc"), iVar3 != 0)) &&
      (iVar3 = strcmp(__s1,"unix"), iVar3 != 0)) &&
     ((iVar3 = strcmp(__s1,"abstract"), iVar3 != 0 && (iVar3 = strcmp(__s1,"socket"), iVar3 != 0))))
  {
    uVar1 = url->u_port;
    uVar2 = nni_url_default_port(__s1);
    if (uVar1 == uVar2) {
      portstr[0] = '\0';
    }
    pcVar4 = strchr(__s,0x3a);
    if (pcVar4 != (char *)0x0) {
      hostcb = "[";
      stack0xffffffffffffff98 = "]";
    }
    if ((portstr[0] & 1U) == 0) {
      local_71[0] = '\0';
    }
    else {
      snprintf(local_71,8,":%u",(ulong)url->u_port);
    }
    pcVar4 = "";
    if (url->u_query != (char *)0x0) {
      pcVar4 = "?";
    }
    if (url->u_query == (char *)0x0) {
      local_c8 = "";
    }
    else {
      local_c8 = url->u_query;
    }
    pcVar5 = "";
    if (url->u_fragment != (char *)0x0) {
      pcVar5 = "#";
    }
    if (url->u_fragment == (char *)0x0) {
      local_e0 = "";
    }
    else {
      local_e0 = url->u_fragment;
    }
    iVar3 = snprintf(str,size,"%s://%s%s%s%s%s%s%s%s%s",__s1,hostcb,__s,stack0xffffffffffffff98,
                     local_71,url->u_path,pcVar4,local_c8,pcVar5,local_e0);
    return iVar3;
  }
  iVar3 = snprintf(str,size,"%s://%s",__s1,url->u_path);
  return iVar3;
}

Assistant:

int
nng_url_sprintf(char *str, size_t size, const nng_url *url)
{
	const char *scheme  = url->u_scheme;
	const char *host    = url->u_hostname;
	const char *hostob  = "";
	const char *hostcb  = "";
	bool        do_port = true;

	if ((strcmp(scheme, "ipc") == 0) || (strcmp(scheme, "inproc") == 0) ||
	    (strcmp(scheme, "unix") == 0) ||
	    (strcmp(scheme, "abstract") == 0) ||
	    (strcmp(scheme, "socket") == 0)) {
		return (snprintf(str, size, "%s://%s", scheme, url->u_path));
	}

	if (url->u_port == nni_url_default_port(scheme)) {
		do_port = false;
	}
	if (strchr(host, ':') != 0) {
		hostob = "[";
		hostcb = "]";
	}
	char portstr[8];
	if (do_port) {
		snprintf(portstr, sizeof(portstr), ":%u", url->u_port);
	} else {
		portstr[0] = 0;
	}
	return (snprintf(str, size, "%s://%s%s%s%s%s%s%s%s%s", scheme, hostob,
	    host, hostcb, portstr, url->u_path,
	    url->u_query != NULL ? "?" : "",
	    url->u_query != NULL ? url->u_query : "",
	    url->u_fragment != NULL ? "#" : "",
	    url->u_fragment != NULL ? url->u_fragment : ""));
}